

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

bool __thiscall
MasterObjectHolder::removeFed(MasterObjectHolder *this,string_view fedName,int validationCode)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  pointer pFVar2;
  element_type *this_00;
  int in_ECX;
  char *in_RDX;
  size_t in_RSI;
  __sv_type __y;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  iterator __end1;
  iterator __begin1;
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  *__range1;
  bool found;
  handle handle;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
  *in_stack_ffffffffffffff30;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff40;
  size_t sVar3;
  char *pcVar4;
  _Self local_88;
  _Self local_68;
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  *local_48;
  byte local_39;
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  local_38;
  int local_1c;
  size_t local_10;
  char *pcStack_8;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::lock((guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
          *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_39 = 0;
  local_48 = gmlc::libguarded::
             lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
             ::operator*(&local_38);
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::begin((deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::end((deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  while (bVar1 = std::operator==(&local_68,&local_88), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
    ::operator*(&local_68);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                       0x1a43c6);
    if (bVar1) {
      pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
               operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                          0x1a43d9);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pFVar2->fedptr);
      if (bVar1) {
        sVar3 = local_10;
        pcVar4 = pcStack_8;
        std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                  ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                   0x1a4405);
        this_00 = std::
                  __shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a4411);
        in_stack_ffffffffffffff30 =
             (_Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
              *)helics::Federate::getName_abi_cxx11_(this_00);
        __y = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff30);
        __x._M_str = pcVar4;
        __x._M_len = sVar3;
        bVar1 = std::operator==(__x,__y);
        if ((bVar1) &&
           (pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
                     operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>
                                 *)0x1a445d), pFVar2->valid == local_1c)) {
          pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
                   operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>
                               *)0x1a4473);
          pFVar2->valid = 0;
          std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                    ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                     0x1a4484);
          std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::reset
                    (in_stack_ffffffffffffff40);
          std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::reset
                    ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                     in_stack_ffffffffffffff30,
                     (pointer)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
          local_39 = 1;
        }
      }
    }
    std::
    _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
    ::operator++(in_stack_ffffffffffffff30);
  }
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
                  *)0x1a44f0);
  return (bool)(local_39 & 1);
}

Assistant:

bool MasterObjectHolder::removeFed(std::string_view fedName, int validationCode)
{
    auto handle = feds.lock();
    bool found{false};
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName && fed->valid == validationCode) {
                fed->valid = 0;
                fed->fedptr.reset();
                fed.reset();
                found = true;
            }
        }
    }
    return found;
}